

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O1

void __thiscall boundingBoxTy::enlarge_pos(boundingBoxTy *this,double lat,double lon)

{
  bool bVar1;
  long lVar2;
  boundingBoxTy *pbVar3;
  double dVar4;
  double d2;
  
  dVar4 = (this->nw)._lon;
  pbVar3 = (boundingBoxTy *)&this->se;
  if (NAN(dVar4)) {
    (this->se)._lat = lat;
    (this->se)._lon = lon;
    (this->se)._alt = NAN;
    (this->se)._ts = NAN;
    (this->se)._head = NAN;
    (this->se)._pitch = NAN;
    (this->se)._roll = NAN;
    (this->se).mergeCount = 1;
    (this->se).f = (posFlagsTy)0x0;
    (this->se).edgeIdx = 0xffffffffffffffff;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (this->nw)._lat = (pbVar3->nw)._lat;
      pbVar3 = (boundingBoxTy *)&(pbVar3->nw)._lon;
      this = (boundingBoxTy *)&(this->nw)._lon;
    }
    return;
  }
  if ((lat < ((positionTy *)pbVar3)->_lat) ||
     (pbVar3 = this, (this->nw)._lat <= lat && lat != (this->nw)._lat)) {
    (pbVar3->nw)._lat = lat;
  }
  dVar4 = HeadingDiff(dVar4,lon);
  d2 = HeadingDiff((this->se)._lon,lon);
  bVar1 = dequal(dVar4,d2);
  if (bVar1) {
    if (0.0 <= dVar4) {
LAB_001295eb:
      (this->se)._lon = lon;
      return;
    }
  }
  else {
    if ((0.0 < dVar4) && (d2 < 0.0)) {
      return;
    }
    if (ABS(d2) <= ABS(dVar4)) goto LAB_001295eb;
  }
  (this->nw)._lon = lon;
  return;
}

Assistant:

void boundingBoxTy::enlarge_pos (double lat, double lon)
{
    // in the special case that the bounding box isn't initialized
    // we make it the size of this point:
    if (std::isnan(nw.lon())) {
        nw = se = positionTy(lat,lon);
        return;
    }
    
    // Latitude is easy as it must be between -90 and 90 degrees
    if (lat < se.lat())
        se.lat() = lat;
    else if (lat > nw.lat())
        nw.lat() = lat;
    
    // Longitude is more complex, the bounding box can be enlarged
    // both to the east or to the west to include lPos.
    // Which way to go? We go the way with the shorter added angle
    const double diffW = HeadingDiff(nw.lon(), lon);
    const double diffE = HeadingDiff(se.lon(), lon);
    
    // There are 2 special cases:
    // 1. The longitude is already included in the bounding box if diffW points east _and_ diffE points west,
    // 2. The bounding box is a single point
    if (dequal(diffW, diffE)) {
        if (diffW < 0.0)                    // extend west-ward
            nw.lon() = lon;
        else                                // else east-ward
            se.lon() = lon;
    }
    // in all other cases we change the edge which requires least change:
    else if (diffW <= 0.0 || diffE >= 0.0)
    {
        if (fabs(diffW) < fabs(diffE))
            nw.lon() = lon;
        else
            se.lon() = lon;
    }
}